

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O0

void __thiscall Assimp::OpenGEX::OpenGEXImporter::copyCameras(OpenGEXImporter *this,aiScene *pScene)

{
  undefined1 auVar1 [16];
  bool bVar2;
  size_type sVar3;
  ulong uVar4;
  aiCamera **ppaVar5;
  iterator __first;
  iterator __last;
  aiScene *pScene_local;
  OpenGEXImporter *this_local;
  
  if (pScene == (aiScene *)0x0) {
    __assert_fail("nullptr != pScene",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/OpenGEX/OpenGEXImporter.cpp"
                  ,0x48c,"void Assimp::OpenGEX::OpenGEXImporter::copyCameras(aiScene *)");
  }
  bVar2 = std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>::empty(&this->m_cameraCache);
  if (!bVar2) {
    sVar3 = std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>::size(&this->m_cameraCache);
    pScene->mNumCameras = (uint)sVar3;
    auVar1 = ZEXT416(pScene->mNumCameras) * ZEXT816(8);
    uVar4 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    ppaVar5 = (aiCamera **)operator_new__(uVar4);
    pScene->mCameras = ppaVar5;
    __first = std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>::begin(&this->m_cameraCache);
    __last = std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>::end(&this->m_cameraCache);
    std::
    copy<__gnu_cxx::__normal_iterator<aiCamera**,std::vector<aiCamera*,std::allocator<aiCamera*>>>,aiCamera**>
              ((__normal_iterator<aiCamera_**,_std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>_>
                )__first._M_current,
               (__normal_iterator<aiCamera_**,_std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>_>
                )__last._M_current,pScene->mCameras);
  }
  return;
}

Assistant:

void OpenGEXImporter::copyCameras( aiScene *pScene ) {
    ai_assert( nullptr != pScene );

    if ( m_cameraCache.empty() ) {
        return;
    }

    pScene->mNumCameras = static_cast<unsigned int>(m_cameraCache.size());
    pScene->mCameras = new aiCamera*[ pScene->mNumCameras ];
    std::copy( m_cameraCache.begin(), m_cameraCache.end(), pScene->mCameras );
}